

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createShaderModuleTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice *ppVVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this;
  VkDevice device;
  DeviceInterface *deviceInterface;
  const_iterator cVar2;
  Move<vk::Handle<(vk::HandleType)14>_> local_88;
  key_type local_68;
  VkShaderModule local_48;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_40;
  
  device = Context::getDevice(context);
  deviceInterface = Context::getDeviceInterface(context);
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          *)context->m_progCollection;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"test","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(this,&local_68);
  ::vk::createShaderModule
            (&local_88,deviceInterface,device,*(ProgramBinary **)(cVar2._M_node + 2),0);
  DStack_40.m_device =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  DStack_40.m_allocator =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  local_48.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  DStack_40.m_deviceIface =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  ppVVar1 = &local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal =
       (deUint64)ppVVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"Creating shader module succeeded","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,
             local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal,
             (undefined1 *)
             ((long)&(local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_deviceIface)->_vptr_DeviceInterface +
             local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal));
  if ((VkDevice *)local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal
      != ppVVar1) {
    operator_delete((void *)local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
                            m_internal,
                    (ulong)(local_88.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                            m_device + 1));
  }
  if (local_48.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_40,local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createShaderModuleTest (Context& context)
{
	const VkDevice					vkDevice	= context.getDevice();
	const DeviceInterface&			vk			= context.getDeviceInterface();
	const Unique<VkShaderModule>	shader		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("test"), 0));

	return tcu::TestStatus::pass("Creating shader module succeeded");
}